

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

ClassDecl * __thiscall SQCompilation::SQParser::ClassExp(SQParser *this,Expr *key)

{
  SQInteger SVar1;
  SQInteger SVar2;
  Expr *args_2;
  ClassDecl *decl;
  NestingChecker nc;
  
  NestingChecker::NestingChecker(&nc,this);
  SVar1 = (this->_lex)._tokenline;
  SVar2 = (this->_lex)._tokencolumn;
  if (this->_token == 0x28) {
    Lex(this);
    args_2 = Expression(this,SQE_RVALUE);
    Expect(this,0x29);
  }
  else if (this->_token == 0x134) {
    Lex(this);
    args_2 = Expression(this,SQE_RVALUE);
  }
  else {
    args_2 = (Expr *)0x0;
  }
  checkBraceIndentationStyle(this);
  Expect(this,0x7b);
  decl = newNode<SQCompilation::ClassDecl,Arena*,SQCompilation::Expr*,SQCompilation::Expr*>
                   (this,this->_astArena,key,args_2);
  ParseTableOrClass(this,&decl->super_TableDecl,0x3b,0x7d);
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.lineStart = (int)SVar1;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.columnStart =
       (int)SVar2;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.lineEnd =
       (int)(this->_lex)._currentline;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.columnEnd =
       (int)(this->_lex)._currentcolumn;
  (nc._p)->_depth = (nc._p)->_depth - nc._depth;
  return decl;
}

Assistant:

ClassDecl* SQParser::ClassExp(Expr *key)
{
    NestingChecker nc(this);
    SQInteger l = line(), c = column();
    Expr *baseExpr = NULL;
    if(_token == TK_EXTENDS) {
        Lex();
        baseExpr = Expression(SQE_RVALUE);
    }
    else if (_token == _SC('(')) {
      Lex();
      baseExpr = Expression(SQE_RVALUE);
      Expect(_SC(')'));
    }
    checkBraceIndentationStyle();
    Expect(_SC('{'));
    ClassDecl *d = newNode<ClassDecl>(arena(), key, baseExpr);
    ParseTableOrClass(d, _SC(';'),_SC('}'));
    return setCoordinates(d, l, c);
}